

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_message.cpp
# Opt level: O1

void pstore::brokerface::send_message(writer *wr,bool error_on_timeout,czstring verb,czstring path)

{
  uint32_t mid;
  size_t sVar1;
  ulong __n;
  difference_type __d;
  long lVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  ushort nump;
  ulong uVar3;
  uint16_t pno;
  string payload;
  long *local_158;
  long local_150;
  long local_148 [2];
  writer *local_138;
  message_type local_130;
  
  local_138 = wr;
  if (verb == (czstring)0x0) {
    assert_failed("verb != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                  ,0x25);
  }
  local_158 = local_148;
  sVar1 = strlen(verb);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,verb,verb + sVar1);
  if ((path != (czstring)0x0) && (*path != '\0')) {
    std::__cxx11::string::append((char *)&local_158);
    std::__cxx11::string::append((char *)&local_158);
  }
  mid = (anonymous_namespace)::message_id;
  uVar3 = (local_150 + 0xf3U) / 0xf4;
  LOCK();
  (anonymous_namespace)::message_id = (anonymous_namespace)::message_id + 1;
  UNLOCK();
  nump = (ushort)uVar3;
  if (nump != 0) {
    pno = 0;
    first._M_current = (char *)local_158;
    do {
      lVar2 = (long)local_158 + (local_150 - (long)first._M_current);
      if (lVar2 < 1) {
        assert_failed("remaining > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/brokerface/send_message.cpp"
                      ,0x41);
      }
      if (0xf3 < lVar2) {
        lVar2 = 0xf4;
      }
      __n = uVar3 & 0xffff;
      message_type::message_type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (&local_130,mid,pno,nump,first,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(first._M_current + lVar2));
      writer::write(local_138,(int)&local_130,(void *)(ulong)error_on_timeout,__n);
      pno = pno + 1;
      first._M_current = first._M_current + lVar2;
    } while (pno < nump);
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  return;
}

Assistant:

void send_message (writer & wr, bool const error_on_timeout, gsl::czstring const verb,
                           gsl::czstring const path) {
            PSTORE_ASSERT (verb != nullptr);

            auto payload = std::string{verb};
            if (path != nullptr && path[0] != '\0') {
                payload.append (" ");
                payload.append (path);
            }

            // Work out the number of pieces into which we need to break this payload.
            using num_parts_type = std::remove_const<decltype (message_type::num_parts)>::type;
            auto const num_parts =
                static_cast<num_parts_type> ((payload.length () + message_type::payload_chars - 1) /
                                             message_type::payload_chars);

            std::uint32_t const mid = message_id++;

            // Build and send each message.
            auto first = std::begin (payload);

            using difference_type = std::iterator_traits<decltype (first)>::difference_type;
            static_assert (message_type::payload_chars <=
                               static_cast<std::make_unsigned<difference_type>::type> (
                                   std::numeric_limits<difference_type>::max ()),
                           "payload_chars is too large to be represented as "
                           "string::iterator::difference_type");

            for (auto part = num_parts_type{0}; part < num_parts; ++part) {
                auto const remaining = std::distance (first, std::end (payload));
                PSTORE_ASSERT (remaining > 0);

                auto last = first;
                std::advance (last, std::min (remaining, static_cast<difference_type> (
                                                             message_type::payload_chars)));

                wr.write (message_type{mid, part, num_parts, first, last}, error_on_timeout);
                first = last;
            }
        }